

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn,int *pbRetryLimit)

{
  u32 *puVar1;
  u16 *puVar2;
  byte *pbVar3;
  WhereTerm **ppWVar4;
  sqlite3_index_constraint_usage *psVar5;
  byte bVar6;
  uint uVar7;
  WhereClause *pWVar8;
  sqlite3_index_constraint_usage *__s;
  WhereLoop *pTemplate;
  Parse *pParse;
  SrcList *pSVar9;
  Table *pTab;
  sqlite3 *psVar10;
  sqlite3_vtab *psVar11;
  i8 iVar12;
  LogEst LVar13;
  int iVar14;
  VTable *pVVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  uchar *puVar22;
  uint uVar23;
  uint uVar24;
  sqlite3_index_constraint *psVar25;
  WhereTerm *pWVar26;
  uint uVar27;
  int iVar28;
  bool bVar29;
  
  pWVar8 = pBuilder->pWC;
  __s = pIdxInfo->aConstraintUsage;
  pTemplate = pBuilder->pNew;
  pParse = pBuilder->pWInfo->pParse;
  pSVar9 = pBuilder->pWInfo->pTabList;
  bVar6 = pTemplate->iTab;
  uVar7 = pIdxInfo->nConstraint;
  *pbIn = 0;
  pTemplate->prereq = mPrereq;
  uVar23 = 0;
  if (0 < (int)uVar7) {
    uVar23 = uVar7;
  }
  puVar22 = &pIdxInfo->aConstraint->usable;
  uVar24 = uVar23;
  while (bVar29 = uVar24 != 0, uVar24 = uVar24 - 1, bVar29) {
    pWVar26 = pWVar8->a;
    iVar14 = *(int *)(puVar22 + 3);
    *puVar22 = '\0';
    if ((((pWVar26[iVar14].prereqRight & ~mUsable) == 0) &&
        ((pWVar26[iVar14].eOperator & mExclude) == 0)) &&
       ((pbRetryLimit != (int *)0x0 || ((byte)(pWVar26[iVar14].eMatchOp + 0xb5) < 0xfe)))) {
      *puVar22 = '\x01';
    }
    puVar22 = puVar22 + 0xc;
  }
  memset(__s,0,(long)(int)uVar7 * 8);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = 5e+98;
  pIdxInfo->estimatedRows = 0x19;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = pSVar9->a[bVar6].colUsed;
  *(undefined4 *)&pIdxInfo[1].aOrderBy = 0;
  pTab = pSVar9->a[bVar6].pTab;
  psVar10 = pParse->db;
  pVVar15 = sqlite3GetVTable(psVar10,pTab);
  psVar11 = pVVar15->pVtab;
  puVar1 = &psVar10->nSchemaLock;
  *puVar1 = *puVar1 + 1;
  iVar14 = (*psVar11->pModule->xBestIndex)(psVar11,pIdxInfo);
  psVar10 = pParse->db;
  puVar1 = &psVar10->nSchemaLock;
  *puVar1 = *puVar1 - 1;
  if ((iVar14 != 0) && (iVar14 != 0x13)) {
    if (iVar14 == 7) {
      sqlite3OomFault(psVar10);
    }
    else {
      pcVar16 = psVar11->zErrMsg;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = sqlite3ErrStr(iVar14);
      }
      sqlite3ErrorMsg(pParse,"%s",pcVar16);
    }
  }
  if (((pTab->u).vtab.p)->bAllSchemas != '\0') {
    iVar28 = pParse->db->nDb;
    iVar21 = 0;
    if (iVar28 < 1) {
      iVar28 = 0;
      iVar21 = 0;
    }
    for (; iVar28 != iVar21; iVar21 = iVar21 + 1) {
      sqlite3CodeVerifySchema(pParse,iVar21);
    }
    if (pParse->writeMask != 0) {
      for (iVar21 = 0; iVar28 != iVar21; iVar21 = iVar21 + 1) {
        sqlite3BeginWriteOperation(pParse,0,iVar21);
      }
    }
  }
  sqlite3_free(psVar11->zErrMsg);
  psVar11->zErrMsg = (char *)0x0;
  if (iVar14 == 0) {
    memset(pTemplate->aLTerm,0,(long)(int)uVar7 * 8);
    *(undefined8 *)((long)&pTemplate->u + 0x10) = 0;
    *(undefined8 *)&pTemplate->u = 0;
    (pTemplate->u).btree.pIndex = (Index *)0x0;
    psVar25 = pIdxInfo->aConstraint;
    uVar24 = 0xffffffff;
    iVar28 = 1;
    for (uVar17 = 0; uVar17 != uVar23; uVar17 = uVar17 + 1) {
      iVar14 = __s[uVar17].argvIndex;
      if (0 < iVar14) {
        if ((int)uVar7 < iVar14) goto LAB_0017e604;
        uVar27 = psVar25->iTermOffset;
        if (((int)uVar27 < 0) || (pWVar8->nTerm <= (int)uVar27)) goto LAB_0017e604;
        uVar20 = iVar14 - 1;
        if ((pTemplate->aLTerm[uVar20] != (WhereTerm *)0x0) || (psVar25->usable == '\0'))
        goto LAB_0017e604;
        pWVar26 = pWVar8->a;
        pTemplate->prereq = pTemplate->prereq | pWVar26[uVar27].prereqRight;
        pWVar26 = pWVar26 + uVar27;
        pTemplate->aLTerm[uVar20] = pWVar26;
        if ((int)uVar24 < (int)uVar20) {
          uVar24 = uVar20;
        }
        if (__s[uVar17].omit != '\0') {
          if ((uVar17 < 0x10) && ((mNoOmit >> ((uint)uVar17 & 0x1f) & 1) == 0)) {
            puVar2 = &(pTemplate->u).btree.nDistinctCol;
            *puVar2 = *puVar2 | (ushort)(1 << ((byte)uVar20 & 0x1f));
          }
          if (pWVar26->eMatchOp == 'J') {
            pbVar3 = (byte *)((long)&pTemplate->u + 4);
            *pbVar3 = *pbVar3 | 2;
          }
        }
        uVar27 = 1 << ((byte)uVar17 & 0x1f);
        if (0x1f < uVar17) {
          uVar27 = 0;
        }
        if ((*(uint *)&pIdxInfo[1].aOrderBy & uVar27) == 0) {
          if ((pWVar26->eOperator & 1) != 0) {
            pIdxInfo->orderByConsumed = 0;
            *(byte *)&pIdxInfo->idxFlags = (byte)pIdxInfo->idxFlags & 0xfe;
            *pbIn = 1;
          }
        }
        else {
          puVar1 = &(pTemplate->u).vtab.mHandleIn;
          *puVar1 = *puVar1 | 1 << ((byte)uVar20 & 0x1f);
        }
        if (0xfd < (byte)(pWVar26->eMatchOp + 0xb5)) {
          if (*pbIn != 0) {
LAB_0017e5b7:
            if (pIdxInfo->needToFreeIdxStr != 0) {
              sqlite3_free(pIdxInfo->idxStr);
              pIdxInfo->idxStr = (char *)0x0;
              pIdxInfo->needToFreeIdxStr = 0;
            }
            *pbRetryLimit = 1;
            return 0;
          }
          uVar18 = 0;
          while (uVar17 != uVar18) {
            psVar5 = __s + uVar18;
            uVar18 = uVar18 + 1;
            if (psVar5->argvIndex < 1) goto LAB_0017e5b7;
          }
        }
      }
      psVar25 = psVar25 + 1;
    }
    pTemplate->nLTerm = (short)uVar24 + 1;
    lVar19 = 0;
    do {
      if ((int)uVar24 < lVar19) {
        (pTemplate->u).vtab.idxNum = pIdxInfo->idxNum;
        *(byte *)((long)&pTemplate->u + 4) =
             *(byte *)((long)&pTemplate->u + 4) & 0xfe | (byte)pIdxInfo->needToFreeIdxStr & 1;
        pIdxInfo->needToFreeIdxStr = 0;
        (pTemplate->u).btree.pIndex = (Index *)pIdxInfo->idxStr;
        if (pIdxInfo->orderByConsumed == 0) {
          iVar12 = '\0';
        }
        else {
          iVar12 = (i8)pIdxInfo->nOrderBy;
        }
        (pTemplate->u).vtab.isOrdered = iVar12;
        pTemplate->rSetup = 0;
        LVar13 = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
        pTemplate->rRun = LVar13;
        LVar13 = sqlite3LogEst(pIdxInfo->estimatedRows);
        pTemplate->nOut = LVar13;
        pTemplate->wsFlags = (pIdxInfo->idxFlags & 1U) << 0xc | pTemplate->wsFlags & 0xffffefff;
        iVar14 = whereLoopInsert(pBuilder,pTemplate);
        if ((undefined1  [24])((undefined1  [24])pTemplate->u & (undefined1  [24])0x100000000) ==
            (undefined1  [24])0x0) {
          return iVar14;
        }
        sqlite3_free((pTemplate->u).btree.pIndex);
        pbVar3 = (byte *)((long)&pTemplate->u + 4);
        *pbVar3 = *pbVar3 & 0xfe;
        return iVar14;
      }
      ppWVar4 = pTemplate->aLTerm + lVar19;
      lVar19 = lVar19 + 1;
    } while (*ppWVar4 != (WhereTerm *)0x0);
LAB_0017e604:
    sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(pSVar9->a[bVar6].pTab)->zName);
  }
  else {
    iVar28 = 0;
    if (iVar14 != 0x13) {
      iVar28 = iVar14;
    }
  }
  return iVar28;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn,                      /* OUT: True if plan uses an IN(...) op */
  int *pbRetryLimit               /* OUT: Retry without LIMIT/OFFSET */
){
  WhereClause *pWC = pBuilder->pWC;
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  SrcItem *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = &pWC->a[pIdxCons->iTermOffset];
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight
     && (pTerm->eOperator & mExclude)==0
     && (pbRetryLimit || !isLimitTerm(pTerm))
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = (sqlite3_int64)pSrc->colUsed;
  pHidden->mHandleIn = 0;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pTab, pIdxInfo);
  if( rc ){
    if( rc==SQLITE_CONSTRAINT ){
      /* If the xBestIndex method returns SQLITE_CONSTRAINT, that means
      ** that the particular combination of parameters provided is unusable.
      ** Make no entries in the loop table.
      */
      WHERETRACE(0xffffffff, ("  ^^^^--- non-viable plan rejected!\n"));
      return SQLITE_OK;
    }
    return rc;
  }

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  memset(pNew->aLTerm, 0, sizeof(pNew->aLTerm[0])*nConstraint );
  memset(&pNew->u.vtab, 0, sizeof(pNew->u.vtab));
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || j>=pWC->nTerm
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
        testcase( pIdxInfo->needToFreeIdxStr );
        return SQLITE_ERROR;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pTerm = &pWC->a[j];
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( pUsage[i].omit ){
        if( i<16 && ((1<<i)&mNoOmit)==0 ){
          testcase( i!=iTerm );
          pNew->u.vtab.omitMask |= 1<<iTerm;
        }else{
          testcase( i!=iTerm );
        }
        if( pTerm->eMatchOp==SQLITE_INDEX_CONSTRAINT_OFFSET ){
          pNew->u.vtab.bOmitOffset = 1;
        }
      }
      if( SMASKBIT32(i) & pHidden->mHandleIn ){
        pNew->u.vtab.mHandleIn |= MASKBIT32(iTerm);
      }else if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }

      /* Unless pbRetryLimit is non-NULL, there should be no LIMIT/OFFSET
      ** terms. And if there are any, they should follow all other terms. */
      assert( pbRetryLimit || !isLimitTerm(pTerm) );
      assert( !isLimitTerm(pTerm) || i>=nConstraint-2 );
      assert( !isLimitTerm(pTerm) || i==nConstraint-1 || isLimitTerm(pTerm+1) );

      if( isLimitTerm(pTerm) && (*pbIn || !allConstraintsUsed(pUsage, i)) ){
        /* If there is an IN(...) term handled as an == (separate call to
        ** xFilter for each value on the RHS of the IN) and a LIMIT or
        ** OFFSET term handled as well, the plan is unusable. Similarly,
        ** if there is a LIMIT/OFFSET and there are other unused terms,
        ** the plan cannot be used. In these cases set variable *pbRetryLimit
        ** to true to tell the caller to retry with LIMIT and OFFSET
        ** disabled. */
        if( pIdxInfo->needToFreeIdxStr ){
          sqlite3_free(pIdxInfo->idxStr);
          pIdxInfo->idxStr = 0;
          pIdxInfo->needToFreeIdxStr = 0;
        }
        *pbRetryLimit = 1;
        return SQLITE_OK;
      }
    }
  }

  pNew->nLTerm = mxTerm+1;
  for(i=0; i<=mxTerm; i++){
    if( pNew->aLTerm[i]==0 ){
      /* The non-zero argvIdx values must be contiguous.  Raise an
      ** error if they are not */
      sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
      testcase( pIdxInfo->needToFreeIdxStr );
      return SQLITE_ERROR;
    }
  }
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffffffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}